

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemImpl.cpp
# Opt level: O3

void efsw::Platform::System::maxFD(void)

{
  rlimit limit;
  rlimit local_18;
  
  if (maxFD()::maxed == '\0') {
    getrlimit(RLIMIT_NOFILE,&local_18);
    local_18.rlim_cur = local_18.rlim_max;
    setrlimit(RLIMIT_NOFILE,&local_18);
    getrlimit(RLIMIT_NOFILE,&local_18);
    maxFD()::maxed = '\x01';
  }
  return;
}

Assistant:

void System::maxFD()
{
	static bool maxed = false;

	if ( !maxed )
	{
		struct rlimit limit;
		getrlimit( RLIMIT_NOFILE, &limit );
		limit.rlim_cur = limit.rlim_max;
		setrlimit( RLIMIT_NOFILE, &limit );

		getrlimit( RLIMIT_NOFILE, &limit );

		efDEBUG( "File descriptor limit %ld\n", limit.rlim_cur );

		maxed = true;
	}
}